

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

char * ctemplate_htmlparser::htmlparser_value(htmlparser_ctx *ctx)

{
  int iVar1;
  char *__src;
  int ext_state;
  htmlparser_ctx *ctx_local;
  
  iVar1 = statemachine_get_state(ctx->statemachine);
  iVar1 = state_external(iVar1);
  if (iVar1 == 3) {
    __src = statemachine_record_buffer(ctx->statemachine);
    strncpy(ctx->value,__src,0x100);
    ctx->value[0xff] = '\0';
    ctx_local = (htmlparser_ctx *)ctx->value;
  }
  else {
    ctx_local = (htmlparser_ctx *)0x0;
  }
  return (char *)ctx_local;
}

Assistant:

const char *htmlparser_value(htmlparser_ctx *ctx)
{
  int ext_state = state_external(statemachine_get_state(ctx->statemachine));
  if (ext_state == HTMLPARSER_STATE_VALUE) {
    strncpy(ctx->value, statemachine_record_buffer(ctx->statemachine),
            HTMLPARSER_MAX_STRING);
    ctx->value[HTMLPARSER_MAX_STRING - 1] = '\0';
    return ctx->value;
  } else {
    return NULL;
  }
}